

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

VkResult Fossilize::CreatePipelineLayout
                   (VkDevice device,VkPipelineLayoutCreateInfo *pCreateInfo,
                   VkAllocationCallbacks *pAllocator,VkPipelineLayout *pLayout)

{
  bool bVar1;
  VkResult VVar2;
  LogLevel LVar3;
  Device *pDVar4;
  
  pDVar4 = get_device_layer(*(VkDevice *)device);
  VVar2 = (*pDVar4->pTable->CreatePipelineLayout)(device,pCreateInfo,pAllocator,pLayout);
  if (VVar2 == VK_SUCCESS) {
    bVar1 = StateRecorder::record_pipeline_layout(pDVar4->recorder,*pLayout,pCreateInfo,0);
    if (!bVar1) {
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 2) {
        bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to record pipeline layout, usually caused by unsupported pNext.\n"
                          );
        if (!bVar1) {
          CreatePipelineLayout();
        }
      }
    }
  }
  return VVar2;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreatePipelineLayout(VkDevice device,
                                                           const VkPipelineLayoutCreateInfo *pCreateInfo,
                                                           const VkAllocationCallbacks *pAllocator,
                                                           VkPipelineLayout *pLayout)
{
	auto *layer = get_device_layer(device);

	VkResult result = layer->getTable()->CreatePipelineLayout(device, pCreateInfo, pAllocator, pLayout);

	if (result == VK_SUCCESS)
	{
		if (!layer->getRecorder().record_pipeline_layout(*pLayout, *pCreateInfo))
			LOGW_LEVEL("Failed to record pipeline layout, usually caused by unsupported pNext.\n");
	}
	return result;
}